

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O3

void __thiscall xercesc_4_0::QName::setNLocalPart(QName *this,XMLCh *localPart,XMLSize_t newLen)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *__dest;
  
  if (this->fLocalPartBufSz < newLen || this->fLocalPartBufSz == 0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fLocalPart);
    this->fLocalPart = (XMLCh *)0x0;
    this->fLocalPartBufSz = newLen + 8;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,newLen * 2 + 0x12);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar1);
    this->fLocalPart = __dest;
  }
  else {
    __dest = this->fLocalPart;
  }
  memmove(__dest,localPart,newLen * 2);
  this->fLocalPart[newLen] = L'\0';
  return;
}

Assistant:

void QName::setNLocalPart(const XMLCh* localPart, const XMLSize_t newLen)
{
    if (!fLocalPartBufSz || (newLen > fLocalPartBufSz))
    {
        fMemoryManager->deallocate(fLocalPart); //delete [] fLocalPart;
        fLocalPart = 0;
        fLocalPartBufSz = newLen + 8;
        fLocalPart = (XMLCh*) fMemoryManager->allocate
        (
            (fLocalPartBufSz + 1) * sizeof(XMLCh)
        ); //new XMLCh[fLocalPartBufSz + 1];
    }
    XMLString::moveChars(fLocalPart, localPart, newLen);
    fLocalPart[newLen] = chNull;
}